

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.hpp
# Opt level: O1

void __thiscall Jzon::Node::setNull(Node *this)

{
  Type TVar1;
  Data *pDVar2;
  bool bVar3;
  
  if (this->data != (Data *)0x0) {
    TVar1 = this->data->type;
    bVar3 = TVar1 == T_NULL;
    if ((!bVar3) && (bVar3 = TVar1 == T_STRING, !bVar3)) {
      bVar3 = TVar1 - T_NUMBER < 2;
    }
    if (bVar3) {
      detach(this);
      pDVar2 = this->data;
      pDVar2->type = T_NULL;
      (pDVar2->valueStr)._M_string_length = 0;
      *(pDVar2->valueStr)._M_dataplus._M_p = '\0';
    }
  }
  return;
}

Assistant:

inline bool isObject() const { return (getType() == T_OBJECT);  }